

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

ValueMapEntryAccessorType * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::mutable_value(MapEntryImpl<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                *this)

{
  ulong uVar1;
  ValueMapEntryAccessorType *pVVar2;
  Arena *arena;
  
  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pVVar2 = this->value_;
  if (pVVar2 == (ValueMapEntryAccessorType *)0x0) {
    pVVar2 = Arena::CreateMaybeMessage<CoreML::Specification::MILSpec::Value>(arena);
    this->value_ = pVVar2;
  }
  return pVVar2;
}

Assistant:

inline ValueMapEntryAccessorType* mutable_value() {
    set_has_value();
    return ValueTypeHandler::EnsureMutable(&value_,
                                           Base::GetArenaForAllocation());
  }